

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupAndCones(Gia_Man_t *p,int *pAnds,int nAnds,int fTrimPis)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Ptr_t *vLeaves_00;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *p_00;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *p_01;
  char *pcVar6;
  void *pvVar7;
  bool bVar8;
  int local_4c;
  Gia_Obj_t *pGStack_48;
  int i;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vRoots;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vLeaves;
  Gia_Man_t *pNew;
  int fTrimPis_local;
  int nAnds_local;
  int *pAnds_local;
  Gia_Man_t *p_local;
  
  vLeaves_00 = Vec_PtrAlloc(100);
  vNodes_00 = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  for (local_4c = 0; local_4c < nAnds; local_4c = local_4c + 1) {
    pGVar5 = Gia_ManObj(p,pAnds[local_4c]);
    Vec_PtrPush(p_00,pGVar5);
  }
  Gia_ManIncrementTravId(p);
  pGVar5 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar5);
  for (local_4c = 0; iVar1 = Vec_PtrSize(p_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pGStack_48 = (Gia_Obj_t *)Vec_PtrEntry(p_00,local_4c);
    Gia_ManDupCones_rec(p,pGStack_48,vLeaves_00,vNodes_00,p_00);
  }
  Vec_PtrSort(vLeaves_00,Gia_ObjCompareByCioId);
  iVar1 = Vec_PtrSize(vLeaves_00);
  iVar2 = Vec_PtrSize(vNodes_00);
  iVar3 = Vec_PtrSize(p_00);
  p_01 = Gia_ManStart(iVar1 + iVar2 + iVar3 + 1);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar6;
  pGVar5 = Gia_ManConst0(p);
  pGVar5->Value = 0;
  if (fTrimPis == 0) {
    local_4c = 0;
    while( true ) {
      iVar1 = Gia_ManPiNum(p);
      bVar8 = false;
      if (local_4c < iVar1) {
        pGStack_48 = Gia_ManCi(p,local_4c);
        bVar8 = pGStack_48 != (Gia_Obj_t *)0x0;
      }
      if (!bVar8) break;
      uVar4 = Gia_ManAppendCi(p_01);
      pGStack_48->Value = uVar4;
      local_4c = local_4c + 1;
    }
  }
  else {
    for (local_4c = 0; iVar1 = Vec_PtrSize(vLeaves_00), local_4c < iVar1; local_4c = local_4c + 1) {
      pvVar7 = Vec_PtrEntry(vLeaves_00,local_4c);
      iVar1 = Gia_ManAppendCi(p_01);
      *(int *)((long)pvVar7 + 8) = iVar1;
    }
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(vNodes_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pGVar5 = (Gia_Obj_t *)Vec_PtrEntry(vNodes_00,local_4c);
    iVar1 = Gia_ObjIsMux(p,pGVar5);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsXor(pGVar5);
      if (iVar1 == 0) {
        iVar1 = Gia_ObjFanin0Copy(pGVar5);
        iVar2 = Gia_ObjFanin1Copy(pGVar5);
        uVar4 = Gia_ManAppendAnd(p_01,iVar1,iVar2);
        pGVar5->Value = uVar4;
      }
      else {
        iVar1 = Gia_ObjFanin0Copy(pGVar5);
        iVar2 = Gia_ObjFanin1Copy(pGVar5);
        uVar4 = Gia_ManAppendXor(p_01,iVar1,iVar2);
        pGVar5->Value = uVar4;
      }
    }
    else {
      iVar1 = Gia_ObjFanin2Copy(p,pGVar5);
      iVar2 = Gia_ObjFanin1Copy(pGVar5);
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      uVar4 = Gia_ManAppendMux(p_01,iVar1,iVar2,iVar3);
      pGVar5->Value = uVar4;
    }
  }
  for (local_4c = 0; iVar1 = Vec_PtrSize(p_00), local_4c < iVar1; local_4c = local_4c + 1) {
    pvVar7 = Vec_PtrEntry(p_00,local_4c);
    Gia_ManAppendCo(p_01,*(int *)((long)pvVar7 + 8));
  }
  Gia_ManSetRegNum(p_01,0);
  Vec_PtrFree(vLeaves_00);
  Vec_PtrFree(vNodes_00);
  Vec_PtrFree(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Gia_ManDupAndCones( Gia_Man_t * p, int * pAnds, int nAnds, int fTrimPis )
{
    Gia_Man_t * pNew;
    Vec_Ptr_t * vLeaves, * vNodes, * vRoots;
    Gia_Obj_t * pObj;
    int i;

    // collect initial POs
    vLeaves = Vec_PtrAlloc( 100 );
    vNodes = Vec_PtrAlloc( 100 );
    vRoots = Vec_PtrAlloc( 100 );
    for ( i = 0; i < nAnds; i++ )
//        Vec_PtrPush( vRoots, Gia_ManPo(p, pPos[i]) );
        Vec_PtrPush( vRoots, Gia_ManObj(p, pAnds[i]) );

    // mark internal nodes
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
        Gia_ManDupCones_rec( p, pObj, vLeaves, vNodes, vRoots );
    Vec_PtrSort( vLeaves, (int (*)(void))Gia_ObjCompareByCioId );

    // start the new manager
//    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Vec_PtrSize(vLeaves) + Vec_PtrSize(vNodes) + Vec_PtrSize(vRoots) + 1);
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // map the constant node
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    if ( fTrimPis )
    {
        Vec_PtrForEachEntry( Gia_Obj_t *, vLeaves, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    else
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManAppendCi( pNew );
    }
    // create LOs
//    Vec_PtrForEachEntryStart( Gia_Obj_t *, vRoots, pObj, i, nPos )
//        Gia_ObjRiToRo(p, pObj)->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Vec_PtrForEachEntry( Gia_Obj_t *, vNodes, pObj, i )
        if ( Gia_ObjIsMux(p, pObj) )
            pObj->Value = Gia_ManAppendMux( pNew, Gia_ObjFanin2Copy(p, pObj), Gia_ObjFanin1Copy(pObj), Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsXor(pObj) )
            pObj->Value = Gia_ManAppendXor( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else 
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create COs
    Vec_PtrForEachEntry( Gia_Obj_t *, vRoots, pObj, i )
//        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, pObj->Value );
    // finalize
//    Gia_ManSetRegNum( pNew, Vec_PtrSize(vRoots)-nPos );
    Gia_ManSetRegNum( pNew, 0 );
    Vec_PtrFree( vLeaves );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vRoots );
    return pNew;

}